

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void icetSendRecvLargeMessages
               (IceTInt numMessagesSending,IceTInt *messageDestinations,IceTBoolean messagesInOrder,
               IceTGenerateData generateDataFunc,IceTHandleData handleDataFunc,
               IceTVoid *incomingBuffer,IceTSizeType bufferSize)

{
  size_t __size;
  char cVar1;
  uint sendcount;
  bool bVar2;
  int iVar3;
  IceTInt *pIVar4;
  IceTInt *pIVar5;
  void *pvVar6;
  void *recvbuf;
  void *__s;
  ulong uVar7;
  IceTVoid *pIVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __size_00;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  IceTVoid *buf;
  long lVar15;
  IceTInt rank;
  IceTSizeType data_size;
  IceTInt comm_size;
  uint local_b4;
  ulong local_b0;
  IceTSizeType local_a4;
  IceTInt *local_a0;
  int *local_98;
  IceTVoid *local_90;
  void *local_88;
  long local_80;
  int *local_78;
  void *local_70;
  IceTGenerateData local_68;
  uint local_5c;
  IceTCommRequest local_58;
  IceTCommRequest local_50;
  IceTHandleData local_40;
  size_t local_38;
  
  local_b0 = CONCAT44(local_b0._4_4_,numMessagesSending);
  local_a0 = messageDestinations;
  local_90 = incomingBuffer;
  local_68 = generateDataFunc;
  local_40 = handleDataFunc;
  icetGetIntegerv(3,(IceTInt *)&local_5c);
  icetGetIntegerv(2,(IceTInt *)&local_b4);
  pIVar4 = icetUnsafeStateGetInteger(0x29);
  pIVar5 = icetUnsafeStateGetInteger(0x2a);
  sendcount = local_5c;
  __size_00 = (size_t)(int)local_5c;
  __size = __size_00 * 4;
  pvVar6 = malloc(__size);
  local_70 = malloc(__size_00);
  recvbuf = malloc((ulong)(sendcount * sendcount));
  local_78 = (int *)malloc(__size);
  local_98 = (int *)malloc(__size);
  __s = malloc(__size);
  if (0 < (long)__size_00) {
    memset(local_70,0,__size_00);
  }
  if (0 < (int)local_b0) {
    uVar9 = 0;
    do {
      iVar12 = local_a0[uVar9];
      *(undefined1 *)((long)local_70 + (long)iVar12) = 1;
      *(int *)((long)pvVar6 + (long)iVar12 * 4) = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while ((local_b0 & 0xffffffff) != uVar9);
  }
  cVar1 = *(char *)((long)local_70 + (long)(int)local_b4);
  *(undefined1 *)((long)local_70 + (long)(int)local_b4) = 0;
  local_88 = pvVar6;
  icetCommAllgather(local_70,sendcount,0x8001,recvbuf);
  uVar9 = (ulong)local_5c;
  local_a0 = (IceTInt *)(ulong)local_b4;
  local_80 = (long)(int)local_b4;
  local_38 = uVar9 * 4;
  local_b0 = 0;
  iVar12 = 0;
  do {
    if ((int)local_5c < 1) {
      bVar2 = true;
    }
    else {
      memset(__s,0xff,local_38);
      uVar7 = 0;
      bVar2 = false;
      do {
        uVar10 = 0;
        do {
          if ((*(char *)((long)recvbuf + uVar10 + uVar7 * uVar9) != '\0') &&
             (*(int *)((long)__s + uVar10 * 4) < 0)) {
            if (messagesInOrder != '\0') {
              iVar3 = pIVar5[uVar7];
              iVar11 = pIVar5[uVar10];
              iVar13 = iVar3;
              if (iVar11 < iVar3) {
                iVar13 = iVar11;
                iVar11 = iVar3;
              }
              lVar14 = (long)iVar13;
              do {
                lVar14 = lVar14 + 1;
                if (iVar11 <= lVar14) break;
              } while (*(char *)((long)recvbuf +
                                (long)(int)(pIVar4[lVar14] * local_5c + (int)uVar10)) == '\0');
              if ((int)lVar14 != iVar11) goto LAB_0011a2f9;
            }
            *(undefined1 *)((long)recvbuf + uVar10 + uVar7 * uVar9) = 0;
            *(int *)((long)__s + uVar10 * 4) = (int)uVar7;
            bVar2 = true;
            if ((IceTInt *)uVar7 == local_a0) {
              lVar14 = (long)iVar12;
              iVar12 = iVar12 + 1;
              local_78[lVar14] = (int)uVar10;
            }
            break;
          }
LAB_0011a2f9:
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar9);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar9);
      bVar2 = !bVar2;
    }
    buf = local_90;
    iVar3 = *(int *)((long)__s + local_80 * 4);
    if (-1 < iVar3) {
      iVar11 = (int)local_b0;
      local_b0 = (ulong)(iVar11 + 1);
      local_98[iVar11] = iVar3;
    }
  } while (!bVar2);
  local_a0 = (IceTInt *)CONCAT71(local_a0._1_7_,0 < (int)local_b0);
  if ((int)local_b0 < 1) {
    local_58 = (IceTCommRequest)0x0;
  }
  else {
    local_58 = icetCommIrecv(local_90,bufferSize,0x8001,*local_98,0x17);
  }
  pvVar6 = local_88;
  if (cVar1 != '\0') {
    pIVar8 = (*local_68)(*(IceTInt *)((long)local_88 + (long)(int)local_b4 * 4),local_b4,&local_a4);
    (*local_40)(pIVar8,local_b4);
  }
  if (iVar12 < 1) {
    local_50 = (IceTCommRequest)0x0;
    if (((int)local_b0 < 1) && (iVar12 < 1)) goto LAB_0011a531;
  }
  else {
    iVar3 = *local_78;
    pIVar8 = (*local_68)(*(IceTInt *)((long)pvVar6 + (long)iVar3 * 4),iVar3,&local_a4);
    buf = local_90;
    local_50 = icetCommIsend(pIVar8,local_a4,0x8001,iVar3,0x17);
  }
  local_80 = (long)iVar12;
  lVar14 = 0;
  lVar15 = 0;
  do {
    lVar15 = (long)(int)lVar15;
    do {
      while (iVar3 = icetCommWaitany(2,&local_58), iVar3 == 1) {
        lVar15 = lVar15 + 1;
        if (lVar15 < local_80) {
          iVar3 = local_78[lVar15];
          pIVar8 = (*local_68)(*(IceTInt *)((long)local_88 + (long)iVar3 * 4),iVar3,&local_a4);
          buf = local_90;
          local_50 = icetCommIsend(pIVar8,local_a4,0x8001,iVar3,0x17);
        }
        if (local_80 <= lVar15 && ((ulong)local_a0 & 1) == 0) goto LAB_0011a531;
      }
    } while (iVar3 != 0);
    (*local_40)(buf,local_98[lVar14]);
    lVar14 = lVar14 + 1;
    iVar3 = (int)lVar14;
    local_a0 = (IceTInt *)CONCAT71(local_a0._1_7_,iVar3 < (int)local_b0);
    if (iVar3 < (int)local_b0) {
      local_58 = icetCommIrecv(buf,bufferSize,0x8001,local_98[lVar14],0x17);
    }
  } while ((iVar3 < (int)local_b0) || ((int)lVar15 < iVar12));
LAB_0011a531:
  free(local_88);
  free(local_70);
  free(recvbuf);
  free(local_78);
  free(local_98);
  free(__s);
  return;
}

Assistant:

void icetSendRecvLargeMessages(IceTInt numMessagesSending,
                               IceTInt *messageDestinations,
                               IceTBoolean messagesInOrder,
                               IceTGenerateData generateDataFunc,
                               IceTHandleData handleDataFunc,
                               IceTVoid *incomingBuffer,
                               IceTSizeType bufferSize)
{
    IceTInt comm_size;
    IceTInt rank;
    IceTInt i;
    IceTInt sender;
    IceTInt numSend, numRecv;
    IceTInt someoneSends;
    IceTInt sendToSelf;
    IceTInt sqi, rqi;     /* Send/Recv queue index. */
    const IceTInt *composite_order;
    const IceTInt *process_orders;

    IceTInt *sendIds;
    IceTByte *myDests;
    IceTByte *allDests;
    IceTInt *sendQueue;
    IceTInt *recvQueue;
    IceTInt *recvFrom;

#define RECV_IDX 0
#define SEND_IDX 1
    IceTCommRequest requests[2];

    icetGetIntegerv(ICET_NUM_PROCESSES, &comm_size);
    icetGetIntegerv(ICET_RANK, &rank);

    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);
    process_orders = icetUnsafeStateGetInteger(ICET_PROCESS_ORDERS);

    /* Allocate structures that manage who sends to what.
       YIKES, that allDests can get really big.  We will have to work around
       that in order to run on supercomputers.  (It is generally used for
       tiled displays.) */
    sendIds = malloc(comm_size * sizeof(IceTInt));
    myDests = malloc(comm_size);
    allDests = malloc(comm_size * comm_size);
    sendQueue = malloc(comm_size * sizeof(IceTInt));
    recvQueue = malloc(comm_size * sizeof(IceTInt));
    recvFrom = malloc(comm_size * sizeof(IceTInt));

  /* Convert array of ranks to a mask of ranks. */
    for (i = 0; i < comm_size; i++) {
        myDests[i] = 0;
    }
    for (i = 0; i < numMessagesSending; i++) {
        myDests[messageDestinations[i]] = 1;
        sendIds[messageDestinations[i]] = i;
    }

  /* We'll just handle send to self as a special case. */
    sendToSelf = myDests[rank];
    myDests[rank] = 0;

  /* Gather masks for all processes. */
    icetCommAllgather(myDests, comm_size, ICET_BYTE, allDests);

  /* Determine communications.  We will determine communications in a
     series of steps.  At each step, we will try to find the most send/recv
     pairs.  Each step will be able to complete without deadlock.  Rather
     than saving the sends and recieves per step, we will simply push them
     into queues and run the send and receive queues in parallel later. */
    numSend = 0;  numRecv = 0;
    do {
        someoneSends = 0;
      /* We are going to keep track of what every processor receives to
         ensure that no processor receives more than one message per
         iteration.  Clear out the array first. */
        for (i = 0; i < comm_size; i++) recvFrom[i] = -1;
      /* Try to find a destination for each sender. */
        for (sender = 0; sender < comm_size; sender++) {
            char *localDests = allDests + sender*comm_size;
            IceTInt receiver;
            for (receiver = 0; receiver < comm_size; receiver++) {
                if (localDests[receiver] && (recvFrom[receiver] < 0)) {
                    if (messagesInOrder) {
                      /* Make sure there is not another message that must
                         be sent first. */
                        IceTInt left, right;
                        if (process_orders[sender] < process_orders[receiver]) {
                            left = process_orders[sender];
                            right = process_orders[receiver];
                        } else {
                            left = process_orders[receiver];
                            right = process_orders[sender];
                        }
                        for (left++; left < right; left++) {
                            IceTInt p = composite_order[left];
                            if (allDests[p*comm_size + receiver]) break;
                        }
                        if (left != right) {
                          /* We have to wait for someone else to send
                             before we can send this one. */
                            continue;
                        }
                    }
                    localDests[receiver] = 0;
                  /* This is no longer necessary since we take care of
                     sentToSelf above
                     
                    if (sender == receiver) {
                        if (rank == sender) sendToSelf = 1;
                        continue;
                    }
                  */
                    recvFrom[receiver] = sender;
                    if (sender == rank) {
                        sendQueue[numSend++] = receiver;
                    }
                    someoneSends = 1;
                    break;
                }
            }
        }
      /* Check to see if we are receiving something this iteration. */
        if (recvFrom[rank] >= 0) {
            recvQueue[numRecv++] = recvFrom[rank];
        }
    } while (someoneSends);
#ifdef DEBUG
    for (i = 0; i < comm_size*comm_size; i++) {
        if (allDests[i] != 0) {
            icetRaiseError("Apperent deadlock encountered.",
                           ICET_SANITY_CHECK_FAIL);
        }
    }
#endif

    sqi = 0;  rqi = 0;
    if (rqi < numRecv) {
        icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
        startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                       &requests[RECV_IDX]);
    } else {
        requests[RECV_IDX] = ICET_COMM_REQUEST_NULL;
    }
    if (sendToSelf) {
        IceTSizeType data_size;
        IceTVoid *data;
        icetRaiseDebug("Sending to self.");
        data = (*generateDataFunc)(sendIds[rank], rank, &data_size);
        (*handleDataFunc)(data, rank);
    }
    if (sqi < numSend) {
        icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
        startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                       generateDataFunc, sendIds);
    } else {
        requests[SEND_IDX] = ICET_COMM_REQUEST_NULL;
    }
    while ((rqi < numRecv) || (sqi < numSend)) {
        icetRaiseDebug("Starting wait.");
        i = icetCommWaitany(2, requests);
        icetRaiseDebug1("Wait returned with %d finished.", (int)i);
        switch (i) {
          case RECV_IDX:
              icetRaiseDebug1("Receive from %d finished", (int)recvQueue[rqi]);
              (*handleDataFunc)(incomingBuffer, recvQueue[rqi]);
              rqi++;
              if (rqi < numRecv) {
                  icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
                  startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                                 &requests[RECV_IDX]);
              }
              continue;
          case SEND_IDX:
              icetRaiseDebug1("Send to %d finished", (int)sendQueue[sqi]);
              sqi++;
              if (sqi < numSend) {
                  icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
                  startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                                 generateDataFunc, sendIds);
              }
              continue;
        }
    }

    free(sendIds);
    free(myDests);
    free(allDests);
    free(sendQueue);
    free(recvQueue);
    free(recvFrom);
}